

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O2

result_type __thiscall
Well<unsigned_int,_32UL,_19UL,_1UL,_16UL,_18UL,_13UL,_Detail::M3<-18>,_Detail::M3<-14>,_Detail::M0,_Detail::M3<18>,_Detail::M3<-24>,_Detail::M3<5>,_Detail::M3<-1>,_Detail::M0,_Detail::NoTempering>
::operator()(Well<unsigned_int,_32UL,_19UL,_1UL,_16UL,_18UL,_13UL,_Detail::M3<_18>,_Detail::M3<_14>,_Detail::M0,_Detail::M3<18>,_Detail::M3<_24>,_Detail::M3<5>,_Detail::M3<_1>,_Detail::M0,_Detail::NoTempering>
             *this)

{
  size_t sVar1;
  uint uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  uint uVar5;
  uint uVar6;
  
  sVar1 = this->index_;
  uVar3 = Detail::Modulo<unsigned_long,_19UL>::calc<unsigned_long>();
  uVar4 = Detail::Modulo<unsigned_long,_19UL>::calc<unsigned_long>(sVar1 + 0x11);
  uVar5 = this->state_[uVar4] & 1 | this->state_[uVar3] & 0xfffffffe;
  uVar2 = this->state_[sVar1];
  uVar4 = Detail::Modulo<unsigned_long,_19UL>::calc<unsigned_long>(sVar1 + 0x10);
  uVar6 = this->state_[uVar4] << 0xe ^ uVar2 << 0x12 ^ uVar2 ^ this->state_[uVar4];
  Detail::Modulo<unsigned_long,_19UL>::calc<unsigned_long>(sVar1 + 0x12);
  uVar4 = Detail::Modulo<unsigned_long,_19UL>::calc<unsigned_long>(sVar1 + 0xd);
  uVar2 = this->state_[uVar4] >> 0x12 ^ this->state_[uVar4];
  uVar5 = uVar2 ^ uVar5 ^ uVar2 * 2 ^ uVar6 ^ uVar6 >> 5 ^ uVar5 << 0x18;
  this->state_[sVar1] = uVar2 ^ uVar6;
  this->state_[uVar3] = uVar5;
  this->index_ = uVar3;
  return uVar5;
}

Assistant:

result_type operator()()
    {
        const UIntType upper_mask = ~0U << p;
        const UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        std::size_t i = index_;
        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        std::size_t j = i + r;
        std::size_t k = mod(j - 1); // [i,r-1]
        std::size_t l = mod(j - 2); // [i,r-2]

        std::size_t im1 = i + m1;
        std::size_t im2 = i + m2;
        std::size_t im3 = i + m3;

        UIntType z0, z1, z2, z3, z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state(im1));
        z2 = T2::transform(state(im2)) ^
             T3::transform(state(im3));
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<r>(z4, state_, im2);
    }